

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O0

void wavwrite(double *x,int x_length,int fs,int nbit,char *filename)

{
  int iVar1;
  int local_40;
  undefined2 local_3c;
  undefined2 local_3a;
  int i;
  int16_t tmp_signal;
  int16_t short_number;
  uint32_t long_number;
  char text [4];
  FILE *fp;
  char *filename_local;
  int nbit_local;
  int fs_local;
  int x_length_local;
  double *x_local;
  
  _long_number = fopen(filename,"wb");
  if (_long_number == (FILE *)0x0) {
    printf("File cannot be opened.\n");
  }
  else {
    _tmp_signal = 0x46464952;
    i = x_length * 2 + 0x24;
    fwrite(&tmp_signal,1,4,_long_number);
    fwrite(&i,4,1,_long_number);
    _tmp_signal = 0x45564157;
    fwrite(&tmp_signal,1,4,_long_number);
    _tmp_signal = 0x20746d66;
    fwrite(&tmp_signal,1,4,_long_number);
    i = 0x10;
    fwrite(&i,4,1,_long_number);
    local_3a = 1;
    fwrite(&local_3a,2,1,_long_number);
    local_3a = 1;
    fwrite(&local_3a,2,1,_long_number);
    i = fs;
    fwrite(&i,4,1,_long_number);
    i = fs << 1;
    fwrite(&i,4,1,_long_number);
    local_3a = 2;
    fwrite(&local_3a,2,1,_long_number);
    local_3a = 0x10;
    fwrite(&local_3a,2,1,_long_number);
    _tmp_signal = 0x61746164;
    fwrite(&tmp_signal,1,4,_long_number);
    i = x_length << 1;
    fwrite(&i,4,1,_long_number);
    for (local_40 = 0; local_40 < x_length; local_40 = local_40 + 1) {
      iVar1 = anon_unknown.dwarf_7d4b::MyMinInt(0x7fff,(int)(x[local_40] * 32767.0));
      iVar1 = anon_unknown.dwarf_7d4b::MyMaxInt(-0x8000,iVar1);
      local_3c = (undefined2)iVar1;
      fwrite(&local_3c,2,1,_long_number);
    }
    fclose(_long_number);
  }
  return;
}

Assistant:

void wavwrite(const double *x, int x_length, int fs, int nbit,
    const char *filename) {
  FILE *fp = fopen(filename, "wb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return;
  }

  char text[4] = {'R', 'I', 'F', 'F'};
  uint32_t long_number = 36 + x_length * 2;
  fwrite(text, 1, 4, fp);
  fwrite(&long_number, 4, 1, fp);

  text[0] = 'W';
  text[1] = 'A';
  text[2] = 'V';
  text[3] = 'E';
  fwrite(text, 1, 4, fp);
  text[0] = 'f';
  text[1] = 'm';
  text[2] = 't';
  text[3] = ' ';
  fwrite(text, 1, 4, fp);

  long_number = 16;
  fwrite(&long_number, 4, 1, fp);
  int16_t short_number = 1;
  fwrite(&short_number, 2, 1, fp);
  short_number = 1;
  fwrite(&short_number, 2, 1, fp);
  long_number = fs;
  fwrite(&long_number, 4, 1, fp);
  long_number = fs * 2;
  fwrite(&long_number, 4, 1, fp);
  short_number = 2;
  fwrite(&short_number, 2, 1, fp);
  short_number = 16;
  fwrite(&short_number, 2, 1, fp);

  text[0] = 'd';
  text[1] = 'a';
  text[2] = 't';
  text[3] = 'a';
  fwrite(text, 1, 4, fp);
  long_number = x_length * 2;
  fwrite(&long_number, 4, 1, fp);

  int16_t tmp_signal;
  for (int i = 0; i < x_length; ++i) {
    tmp_signal = static_cast<int16_t>(MyMaxInt(-32768,
        MyMinInt(32767, static_cast<int>(x[i] * 32767))));
    fwrite(&tmp_signal, 2, 1, fp);
  }

  fclose(fp);
}